

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::shaderexecutor::UnpackUnorm4x8Case::createInstance(UnpackUnorm4x8Case *this,Context *ctx)

{
  ShaderPackingFunctionTestInstance *this_00;
  
  this_00 = (ShaderPackingFunctionTestInstance *)operator_new(0xa8);
  ShaderPackingFunctionTestInstance::ShaderPackingFunctionTestInstance
            (this_00,ctx,(this->super_ShaderPackingFunctionCase).m_shaderType,
             &(this->super_ShaderPackingFunctionCase).m_spec,
             (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_name._M_dataplus._M_p);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderPackingFunctionTestInstance_00d347a0;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* createInstance (Context& ctx) const
	{
		return new UnpackUnorm4x8CaseInstance(ctx, m_shaderType, m_spec, getName());
	}